

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

uint32_t __thiscall
Handler::CalculateMigrateValue
          (Handler *this,PurchasedServer *purchasedServer,VirtualMachine *vm,LOCATION *location)

{
  uint16_t energyCost;
  ushort uVar1;
  ushort uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  uint16_t uVar6;
  LOCATION LVar7;
  bool bVar8;
  uint16_t cpuCore;
  uint32_t uVar9;
  
  energyCost = (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
               super__Vector_impl_data._M_start[purchasedServer->serverIdx].energyCost;
  uVar1 = vm->cpuCore;
  uVar2 = vm->memorySize;
  LVar7 = *location;
  if (LVar7 == NODE_A) {
    bVar8 = CheckCapacity(purchasedServer,vm,location);
    if (!bVar8) {
      return 0;
    }
    uVar5 = purchasedServer->remainCpuCoreA;
    cpuCore = uVar5 - uVar1;
    uVar6 = purchasedServer->remainMemorySizeA;
  }
  else {
    if (LVar7 != NODE_B) {
      if (LVar7 != ALL) {
        return 0;
      }
      bVar8 = CheckCapacity(purchasedServer,vm,location);
      if (!bVar8) {
        return 0;
      }
      uVar3 = purchasedServer->remainCpuCoreA;
      uVar4 = purchasedServer->remainMemorySizeA;
      cpuCore = (uVar3 - (uVar1 & 0xfffe)) + purchasedServer->remainCpuCoreB;
      uVar6 = (uVar4 - (uVar2 & 0xfffe)) + purchasedServer->remainMemorySizeB;
      goto LAB_0010de18;
    }
    bVar8 = CheckCapacity(purchasedServer,vm,location);
    if (!bVar8) {
      return 0;
    }
    cpuCore = purchasedServer->remainCpuCoreB - uVar1;
    uVar6 = purchasedServer->remainMemorySizeB;
  }
  uVar6 = uVar6 - uVar2;
LAB_0010de18:
  uVar9 = CalculateMigrateValue(this,cpuCore,uVar6,energyCost);
  return uVar9;
}

Assistant:

uint32_t Handler::CalculateMigrateValue(const PurchasedServer &purchasedServer, const VirtualMachine &vm, const LOCATION &location) {
    uint16_t energyCost = servers[purchasedServer.serverIdx].energyCost;
    uint16_t cpuCore = vm.cpuCore;
    uint16_t memorySize = vm.memorySize;

    if (location == ALL && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t halfCpuCore = cpuCore >> 1u;
        uint16_t halfMemorySize = memorySize >> 1u;
        uint16_t remainCpuCoreA = purchasedServer.remainCpuCoreA - halfCpuCore;
        uint16_t remainMemorySizeA = purchasedServer.remainMemorySizeA - halfMemorySize;
        uint16_t remainCpuCoreB = purchasedServer.remainCpuCoreB - halfCpuCore;
        uint16_t remainMemorySizeB = purchasedServer.remainMemorySizeB - halfMemorySize;
        return CalculateMigrateValue(remainCpuCoreA + remainCpuCoreB, remainMemorySizeA + remainMemorySizeB, energyCost);
    }

    if (location == NODE_A && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t remainCpuCoreA = purchasedServer.remainCpuCoreA - cpuCore;
        uint16_t remainMemorySizeA = purchasedServer.remainMemorySizeA - memorySize;
        return CalculateMigrateValue(remainCpuCoreA, remainMemorySizeA, energyCost);
    }

    if (location == NODE_B && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t remainCpuCoreB = purchasedServer.remainCpuCoreB - cpuCore;
        uint16_t remainMemorySizeB = purchasedServer.remainMemorySizeB - memorySize;
        return CalculateMigrateValue(remainCpuCoreB, remainMemorySizeB, energyCost);
    }

    return 0u;
}